

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,3>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *fmt;
  undefined8 *puVar1;
  bool *pbVar2;
  _Rb_tree_node_base *p_Var3;
  pointer pMVar4;
  pointer pMVar5;
  Variable<tcu::Matrix<float,_3,_2>_> *pVVar6;
  pointer pcVar7;
  Variable<tcu::Matrix<float,_2,_3>_> *pVVar8;
  double dVar9;
  undefined8 uVar10;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar11;
  PrecisionCase *pPVar12;
  ContextType type;
  int iVar13;
  _Rb_tree_node_base *p_Var14;
  char *pcVar15;
  size_t sVar16;
  long *plVar17;
  ShaderExecutor *pSVar18;
  Interval *pIVar19;
  IVal *pIVar20;
  MessageBuilder *pMVar21;
  TestError *this_00;
  uint uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  undefined1 *puVar24;
  Matrix<float,_3,_2> *val;
  long lVar25;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  IVal reference1;
  IVal in2;
  IVal in3;
  Environment env;
  ostringstream os;
  FuncSet funcs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_548 [15];
  IVal local_539;
  IVal *local_538;
  string local_530;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_510;
  size_t local_508;
  Statement *local_500;
  PrecisionCase *local_4f8;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4f0;
  string local_4e8;
  ulong local_4c8;
  ResultCollector *local_4c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4b8;
  undefined1 local_488 [8];
  pointer pVStack_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  double local_468;
  Data local_460;
  undefined4 local_450;
  ios_base local_418 [8];
  ios_base local_410 [264];
  undefined1 local_308 [16];
  undefined1 local_2f8 [24];
  double local_2e0;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_278;
  FloatFormat local_248;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pMVar4 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_508 = ((long)pMVar5 - (long)pMVar4 >> 3) * -0x5555555555555555;
  local_510 = variables;
  local_500 = stmt;
  local_4f0 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_278,local_508);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_248.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_248.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_248.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_248.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_248.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_248.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_248.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_248.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_248._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4b8._M_impl.super__Rb_tree_header._M_header;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_488 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"Statement: ",0xb);
  (*local_500->_vptr_Statement[2])(local_500,(ostringstream *)&pVStack_480);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
  std::ios_base::~ios_base(local_410);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_308 + 8);
  local_308._8_4_ = _S_red;
  local_2f8._0_8_ = (_Base_ptr)0x0;
  local_2e0 = 0.0;
  local_538 = (IVal *)pMVar4;
  local_2f8._8_8_ = p_Var3;
  local_2f8._16_8_ = p_Var3;
  (*local_500->_vptr_Statement[4])(local_500,local_308);
  if ((_Rb_tree_node_base *)local_2f8._8_8_ != p_Var3) {
    p_Var14 = (_Rb_tree_node_base *)local_2f8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var3);
  }
  if (local_2e0 != 0.0) {
    local_488 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_480,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_480,local_530._M_dataplus._M_p,local_530._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
    std::ios_base::~ios_base(local_410);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_308);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"precision ",10);
  pcVar15 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)(auStack_548 + *(long *)((long)local_488 + -0x18)) + 0xc0);
  }
  else {
    sVar16 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,pcVar15,sVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar7 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar7) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar17 = (long *)std::__cxx11::string::append(local_1a8);
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar23) {
      local_478._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_478._8_8_ = plVar17[3];
      local_488 = (undefined1  [8])&local_478;
    }
    else {
      local_478._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_488 = (undefined1  [8])*plVar17;
    }
    pVStack_480 = (pointer)plVar17[1];
    *plVar17 = (long)paVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_488);
    if (local_488 != (undefined1  [8])&local_478) {
      operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar7) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_488,this,
             (local_510->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar10 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_488);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  if (local_488 != (undefined1  [8])&local_478) {
    operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Matrix<float,2,3>>
            ((Symbol *)local_488,this,
             (local_510->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
             .m_ptr);
  uVar10 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_488);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_468);
  glu::VarType::~VarType((VarType *)&local_468);
  if (local_488 != (undefined1  [8])&local_478) {
    operator_delete((void *)local_488,local_478._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  (*local_500->_vptr_Statement[2])(local_500,local_488);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base(local_418);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar7) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar18 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_488 = (undefined1  [8])
              (local_4f0->in0).
              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_480 = (local_4f0->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_478._M_allocated_capacity =
       (size_type)
       (local_4f0->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_478._8_8_ =
       (local_4f0->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_278.out0.
       super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_278.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar18->_vptr_ShaderExecutor[3])
            (pSVar18,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar13 = (*pSVar18->_vptr_ShaderExecutor[2])(pSVar18);
  if ((char)iVar13 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar18->_vptr_ShaderExecutor[5])(pSVar18);
  pIVar20 = (IVal *)local_1a8;
  (*pSVar18->_vptr_ShaderExecutor[6])(pSVar18,local_508,local_488);
  (*pSVar18->_vptr_ShaderExecutor[1])(pSVar18);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_488);
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_1a8);
  pVVar11 = local_510;
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_4b8,
             (local_510->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_488);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_4b8,
             (pVVar11->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_308);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_4b8,
             (pVVar11->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_530);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_4b8,
             (pVVar11->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4e8);
  Environment::bind<tcu::Matrix<float,2,3>>
            ((Environment *)&local_4b8,
             (pVVar11->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_4b8,
             (pVVar11->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_539);
  local_4f8 = this;
  if ((IVal *)pMVar5 == local_538) {
    local_538 = (IVal *)0x0;
  }
  else {
    fmt = &(this->m_ctx).floatFormat;
    local_4c0 = &this->m_status;
    local_4c8 = local_508 + (local_508 == 0);
    uVar27 = 0;
    local_538 = (IVal *)0x0;
    do {
      tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_1a8);
      if ((uVar27 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_4f8->super_TestCase).super_TestNode.m_testCtx);
      }
      round<tcu::Matrix<float,3,2>>
                ((IVal *)local_308,(BuiltinPrecisionTests *)fmt,
                 (FloatFormat *)
                 ((local_4f0->in0).
                  super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar27),(Matrix<float,_3,_2> *)pIVar20
                );
      pVVar11 = local_510;
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_488,fmt,(IVal *)local_308);
      pIVar19 = (Interval *)
                Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_4b8,
                           (pVVar11->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      lVar25 = 0;
      pMVar21 = (MessageBuilder *)local_488;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)((long)&pIVar19->m_hi + lVar26) =
               *(undefined8 *)
                (&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar26);
          puVar1 = (undefined8 *)((long)&pMVar21->m_log + lVar26);
          dVar9 = (double)puVar1[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_3>,_2> *)&pIVar19->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar26;
          *(undefined8 *)pbVar2 = *puVar1;
          *(double *)(pbVar2 + 8) = dVar9;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 == 0x48);
        lVar25 = lVar25 + 1;
        pIVar19 = pIVar19 + 1;
        pMVar21 = (MessageBuilder *)
                  &(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar25 != 3);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_4b8,
                 (pVVar11->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_4b8,
                 (pVVar11->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_4b8,
                 (pVVar11->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_460.basic.type = (local_4f8->m_ctx).precision;
      local_468 = (this->m_ctx).floatFormat.m_maxValue;
      local_488 = *(undefined1 (*) [8])fmt;
      pVStack_480 = *(pointer *)&(this->m_ctx).floatFormat.m_fractionBits;
      local_478._M_allocated_capacity = *(undefined8 *)&(this->m_ctx).floatFormat.m_hasInf;
      local_478._8_8_ = *(undefined8 *)&(this->m_ctx).floatFormat.m_exactPrecision;
      local_450 = 0;
      local_460._8_8_ = &local_4b8;
      (*local_500->_vptr_Statement[3])(local_500,(MessageBuilder *)local_488);
      pIVar20 = Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)&local_4b8,
                           (pVVar11->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                ((IVal *)local_488,&local_248,pIVar20);
      puVar24 = local_1a8;
      pMVar21 = (MessageBuilder *)local_488;
      lVar25 = 0;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)(puVar24 + lVar26 + 0x10) =
               *(undefined8 *)
                (&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar26);
          puVar1 = (undefined8 *)((long)&pMVar21->m_log + lVar26);
          uVar10 = puVar1[1];
          *(undefined8 *)(puVar24 + lVar26) = *puVar1;
          *(undefined8 *)((long)(puVar24 + lVar26) + 8) = uVar10;
          lVar26 = lVar26 + 0x30;
        } while (lVar26 != 0x90);
        puVar24 = puVar24 + 0x18;
        pMVar21 = (MessageBuilder *)
                  &(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        bVar28 = lVar25 == 0;
        lVar25 = lVar25 + 1;
      } while (bVar28);
      bVar28 = contains<tcu::Matrix<float,2,3>>
                         ((IVal *)local_1a8,
                          local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar27);
      local_488 = (undefined1  [8])&local_478;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_488,"Shader output 0 is outside acceptable range","");
      bVar28 = tcu::ResultCollector::check(local_4c0,bVar28,(string *)local_488);
      if (local_488 != (undefined1  [8])&local_478) {
        operator_delete((void *)local_488,(ulong)(local_478._M_allocated_capacity + 1));
      }
      uVar22 = (int)local_538 + ((byte)~bVar28 & 1);
      pIVar20 = (IVal *)(ulong)uVar22;
      local_538 = pIVar20;
      if ((int)uVar22 < 0x65 && !bVar28) {
        local_488 = (undefined1  [8])((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
        pcVar15 = "Failed";
        if (bVar28) {
          pcVar15 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,pcVar15,6);
        pVVar11 = local_510;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\t",1);
        pVVar6 = (pVVar11->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                 .m_ptr;
        val = (Matrix<float,_3,_2> *)local_2f8;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_308._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_308,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,(char *)local_308._0_8_,
                   CONCAT44(local_308._12_4_,local_308._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," = ",3);
        valueToString<tcu::Matrix<float,3,2>>
                  (&local_530,(BuiltinPrecisionTests *)&local_248,
                   (FloatFormat *)
                   ((local_4f0->in0).
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar27),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,local_530._M_dataplus._M_p,local_530._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_3,_2> *)local_308._0_8_ != (Matrix<float,_3,_2> *)local_2f8) {
          operator_delete((void *)local_308._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_2f8._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\t",1);
        pVVar8 = (pVVar11->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
                 .m_ptr;
        pIVar20 = (IVal *)local_2f8;
        pcVar7 = (pVVar8->m_name)._M_dataplus._M_p;
        local_308._0_8_ = pIVar20;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_308,pcVar7,pcVar7 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,(char *)local_308._0_8_,
                   CONCAT44(local_308._12_4_,local_308._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," = ",3);
        valueToString<tcu::Matrix<float,2,3>>
                  (&local_530,(BuiltinPrecisionTests *)&local_248,
                   (FloatFormat *)
                   (local_278.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar27),
                   (Matrix<float,_2,_3> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,local_530._M_dataplus._M_p,local_530._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,3>>
                  (&local_4e8,(BuiltinPrecisionTests *)&local_248,(FloatFormat *)local_1a8,pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_480,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_308._0_8_ != (IVal *)local_2f8) {
          operator_delete((void *)local_308._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_2f8._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
        std::ios_base::~ios_base(local_410);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != local_4c8);
  }
  pPVar12 = local_4f8;
  iVar13 = (int)local_538;
  if (100 < iVar13) {
    local_488 = (undefined1  [8])((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"(Skipped ",9);
    std::ostream::operator<<((ostringstream *)&pVStack_480,iVar13 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
    std::ios_base::~ios_base(local_410);
  }
  if (iVar13 == 0) {
    local_488 = (undefined1  [8])((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_480);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_480," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_488 = (undefined1  [8])((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_480);
    std::ostream::operator<<((ostringstream *)&pVStack_480,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_480,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_480);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_480," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_480);
  std::ios_base::~ios_base(local_410);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_278.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.out0.
      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}